

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImDrawList::ImDrawList(ImDrawList *this,ImDrawListSharedData *shared_data)

{
  ImDrawListSharedData *shared_data_local;
  ImDrawList *this_local;
  
  ImVector<ImDrawCmd>::ImVector(&this->CmdBuffer);
  ImVector<unsigned_short>::ImVector(&this->IdxBuffer);
  ImVector<ImDrawVert>::ImVector(&this->VtxBuffer);
  ImVector<ImVec4>::ImVector(&this->_ClipRectStack);
  ImVector<void_*>::ImVector(&this->_TextureIdStack);
  ImVector<ImVec2>::ImVector(&this->_Path);
  ImDrawListSplitter::ImDrawListSplitter(&this->_Splitter);
  this->_Data = shared_data;
  this->_OwnerName = (char *)0x0;
  Clear(this);
  return;
}

Assistant:

ImDrawList(const ImDrawListSharedData* shared_data) { _Data = shared_data; _OwnerName = NULL; Clear(); }